

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::DBTest_ReadWrite_Test::~DBTest_ReadWrite_Test(DBTest_ReadWrite_Test *this)

{
  DBTest_ReadWrite_Test *this_local;
  
  ~DBTest_ReadWrite_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(DBTest, ReadWrite) {
  do {
    ASSERT_LEVELDB_OK(Put("foo", "v1"));
    ASSERT_EQ("v1", Get("foo"));
    ASSERT_LEVELDB_OK(Put("bar", "v2"));
    ASSERT_LEVELDB_OK(Put("foo", "v3"));
    ASSERT_EQ("v3", Get("foo"));
    ASSERT_EQ("v2", Get("bar"));
  } while (ChangeOptions());
}